

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall Clasp::Solver::undoLevel(Solver *this,bool sp)

{
  ConstraintDB *pCVar1;
  Constraint *pCVar2;
  uint uVar3;
  ulong uVar4;
  ConstraintDB *undoList;
  
  Assignment::undoTrail
            (&this->assign_,
             *(uint *)((this->levels_).super_type.ebo_.buf +
                      ((this->levels_).super_type.ebo_.size - 1)) & 0x3fffffff,sp);
  uVar3 = (this->levels_).super_type.ebo_.size - 1;
  pCVar1 = (this->levels_).super_type.ebo_.buf[uVar3].undo;
  if (pCVar1 != (ConstraintDB *)0x0) {
    uVar3 = (pCVar1->ebo_).size;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pCVar2 = (pCVar1->ebo_).buf[uVar4];
      (*pCVar2->_vptr_Constraint[3])(pCVar2,this);
    }
    undoFree(this,(this->levels_).super_type.ebo_.buf[(this->levels_).super_type.ebo_.size - 1].undo
            );
    uVar3 = (this->levels_).super_type.ebo_.size - 1;
  }
  (this->levels_).super_type.ebo_.size = uVar3;
  return;
}

Assistant:

void Solver::undoLevel(bool sp) {
	assert(decisionLevel() != 0 && levels_.back().trailPos != assign_.trail.size() && "Decision Level must not be empty");
	assign_.undoTrail(levels_.back().trailPos, sp);
	if (levels_.back().undo) {
		const ConstraintDB& undoList = *levels_.back().undo;
		for (ConstraintDB::size_type i = 0, end = undoList.size(); i != end; ++i) {
			undoList[i]->undoLevel(*this);
		}
		undoFree(levels_.back().undo);
	}
	levels_.pop_back();
}